

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

void RemoveUnnecessaryTransactions(PartiallySignedTransaction *psbtx,int *sighash_type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint *puVar1;
  iterator iVar2;
  iterator iVar3;
  bool bVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pPVar8;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> wit_prog;
  int wit_ver;
  vector<unsigned_int,_std::allocator<unsigned_int>_> to_drop;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  int local_60;
  uint local_5c;
  uint *local_58;
  iterator iStack_50;
  uint *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*sighash_type & 0x80) == 0) {
    local_58 = (uint *)0x0;
    iStack_50._M_current = (uint *)0x0;
    local_48 = (uint *)0x0;
    local_5c = 0;
    pPVar8 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = local_58;
    iVar2._M_current = iStack_50._M_current;
    if ((psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar8) {
      uVar7 = 0;
      do {
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pPVar8[uVar7].witness_utxo.nValue == -1) {
LAB_00da3497:
          if (iStack_50._M_current != local_58) {
            iStack_50._M_current = local_58;
          }
          puVar1 = local_58;
          iVar2._M_current = iStack_50._M_current;
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            puVar1 = local_58;
            iVar2._M_current = iStack_50._M_current;
          }
          break;
        }
        bVar4 = CScript::IsWitnessProgram
                          (&pPVar8[uVar7].witness_utxo.scriptPubKey,&local_60,&local_78);
        if ((!bVar4) || (local_60 == 0)) goto LAB_00da3497;
        if (pPVar8[uVar7].non_witness_utxo.
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (iStack_50._M_current == local_48) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,iStack_50,
                       &local_5c);
          }
          else {
            *iStack_50._M_current = local_5c;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
        if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_5c = local_5c + 1;
        uVar7 = (ulong)local_5c;
        pPVar8 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = ((long)(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 5) *
                -0x70a3d70a3d70a3d7;
        puVar1 = local_58;
        iVar2._M_current = iStack_50._M_current;
      } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
    }
    do {
      iVar3._M_current = iStack_50._M_current;
      if (puVar1 == iStack_50._M_current) goto LAB_00da3518;
      uVar6 = (ulong)*puVar1;
      pPVar8 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 5) *
              -0x70a3d70a3d70a3d7;
      if (uVar7 < uVar6 || uVar7 - uVar6 == 0) {
        iStack_50._M_current = iVar2._M_current;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar5 = std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_58 != (uint *)0x0) {
            operator_delete(local_58,(long)local_48 - (long)local_58);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar5);
          }
        }
        goto LAB_00da35c5;
      }
      this = pPVar8[uVar6].non_witness_utxo.
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      pPVar8[uVar6].non_witness_utxo.
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pPVar8[uVar6].non_witness_utxo.
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iStack_50._M_current = iVar2._M_current;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      puVar1 = puVar1 + 1;
      iVar2._M_current = iStack_50._M_current;
      iStack_50._M_current = iVar3._M_current;
    } while( true );
  }
LAB_00da352f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00da35c5:
  __stack_chk_fail();
LAB_00da3518:
  iStack_50._M_current = iVar2._M_current;
  if (local_58 != (uint *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  goto LAB_00da352f;
}

Assistant:

void RemoveUnnecessaryTransactions(PartiallySignedTransaction& psbtx, const int& sighash_type)
{
    // Only drop non_witness_utxos if sighash_type != SIGHASH_ANYONECANPAY
    if ((sighash_type & 0x80) != SIGHASH_ANYONECANPAY) {
        // Figure out if any non_witness_utxos should be dropped
        std::vector<unsigned int> to_drop;
        for (unsigned int i = 0; i < psbtx.inputs.size(); ++i) {
            const auto& input = psbtx.inputs.at(i);
            int wit_ver;
            std::vector<unsigned char> wit_prog;
            if (input.witness_utxo.IsNull() || !input.witness_utxo.scriptPubKey.IsWitnessProgram(wit_ver, wit_prog)) {
                // There's a non-segwit input or Segwit v0, so we cannot drop any witness_utxos
                to_drop.clear();
                break;
            }
            if (wit_ver == 0) {
                // Segwit v0, so we cannot drop any non_witness_utxos
                to_drop.clear();
                break;
            }
            if (input.non_witness_utxo) {
                to_drop.push_back(i);
            }
        }

        // Drop the non_witness_utxos that we can drop
        for (unsigned int i : to_drop) {
            psbtx.inputs.at(i).non_witness_utxo = nullptr;
        }
    }
}